

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall MyDocument::MyDocument(MyDocument *this,char *name,bool open,ImVec4 *color)

{
  float fVar1;
  ImVec4 *color_local;
  bool open_local;
  char *name_local;
  MyDocument *this_local;
  
  ImVec4::ImVec4(&this->Color);
  this->Name = name;
  this->OpenPrev = open;
  this->Open = open;
  this->Dirty = false;
  this->WantClose = false;
  fVar1 = color->y;
  (this->Color).x = color->x;
  (this->Color).y = fVar1;
  fVar1 = color->w;
  (this->Color).z = color->z;
  (this->Color).w = fVar1;
  return;
}

Assistant:

MyDocument(const char* name, bool open = true, const ImVec4& color = ImVec4(1.0f,1.0f,1.0f,1.0f))
    {
        Name = name;
        Open = OpenPrev = open;
        Dirty = false;
        WantClose = false;
        Color = color;
    }